

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::level_formatter<spdlog::details::scoped_padder>::format
          (level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *begin;
  size_t wrapped_size;
  long lVar1;
  char *buf_ptr;
  scoped_padder p;
  scoped_padder local_40;
  
  lVar1 = (long)(int)msg->level * 0x10;
  begin = *(char **)(level::level_string_views + lVar1);
  wrapped_size = *(size_t *)(level::level_string_views + lVar1 + 8);
  scoped_padder::scoped_padder(&local_40,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  ::fmt::v11::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,begin,begin + wrapped_size);
  scoped_padder::~scoped_padder(&local_40);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }